

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

void __thiscall Potassco::SmodelsInput::matchBody(SmodelsInput *this,RuleBuilder *rule)

{
  uint uVar1;
  Atom_t a;
  uint lit;
  RuleBuilder *in_RSI;
  char *in_RDI;
  Lit_t p;
  uint32_t neg;
  uint32_t len;
  undefined4 in_stack_ffffffffffffffe0;
  Lit_t in_stack_ffffffffffffffe4;
  undefined4 local_18;
  
  uVar1 = ProgramReader::matchPos
                    ((ProgramReader *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (uint)((ulong)in_RDI >> 0x20),(char *)0x13ad88);
  local_18 = ProgramReader::matchPos
                       ((ProgramReader *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (uint)((ulong)in_RDI >> 0x20),(char *)0x13ada1);
  RuleBuilder::startBody
            ((RuleBuilder *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  while (lit = uVar1 - 1, uVar1 != 0) {
    a = ProgramReader::matchAtom
                  ((ProgramReader *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_RDI);
    in_stack_ffffffffffffffe4 = Potassco::lit(a);
    if (local_18 != 0) {
      in_stack_ffffffffffffffe4 = -in_stack_ffffffffffffffe4;
      local_18 = local_18 - 1;
    }
    RuleBuilder::addGoal(in_RSI,lit);
    uVar1 = lit;
  }
  return;
}

Assistant:

void SmodelsInput::matchBody(RuleBuilder& rule) {
	uint32_t len = matchPos();
	uint32_t neg = matchPos();
	for (rule.startBody(); len--;) {
		Lit_t p = lit(matchAtom());
		if (neg) { p *= -1; --neg; }
		rule.addGoal(p);
	}
}